

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O2

void av1_setup_shared_coeff_buffer
               (SequenceHeader *seq_params,PC_TREE_SHARED_BUFFERS *shared_bufs,
               aom_internal_error_info *error)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  tran_low_t *ptVar6;
  long lVar7;
  size_t size;
  
  uVar1 = seq_params->monochrome;
  bVar2 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[seq_params->sb_size];
  iVar3 = seq_params->subsampling_y;
  iVar4 = seq_params->subsampling_x;
  for (lVar7 = 0; (ulong)(uVar1 == '\0') * 2 + 1 != lVar7; lVar7 = lVar7 + 1) {
    bVar5 = (char)iVar3 + (char)iVar4;
    if (lVar7 == 0) {
      bVar5 = 0;
    }
    size = (long)((1 << (bVar2 & 0x1f)) >> (bVar5 & 0x1f)) << 2;
    ptVar6 = (tran_low_t *)aom_memalign(0x20,size);
    shared_bufs->coeff_buf[lVar7] = ptVar6;
    if (ptVar6 == (tran_low_t *)0x0) {
      aom_internal_error(error,AOM_CODEC_MEM_ERROR,"Failed to allocate shared_bufs->coeff_buf[i]");
    }
    ptVar6 = (tran_low_t *)aom_memalign(0x20,size);
    shared_bufs->qcoeff_buf[lVar7] = ptVar6;
    if (ptVar6 == (tran_low_t *)0x0) {
      aom_internal_error(error,AOM_CODEC_MEM_ERROR,"Failed to allocate shared_bufs->qcoeff_buf[i]");
    }
    ptVar6 = (tran_low_t *)aom_memalign(0x20,size);
    shared_bufs->dqcoeff_buf[lVar7] = ptVar6;
    if (ptVar6 == (tran_low_t *)0x0) {
      aom_internal_error(error,AOM_CODEC_MEM_ERROR,"Failed to allocate shared_bufs->dqcoeff_buf[i]")
      ;
    }
  }
  return;
}

Assistant:

void av1_setup_shared_coeff_buffer(const SequenceHeader *const seq_params,
                                   PC_TREE_SHARED_BUFFERS *shared_bufs,
                                   struct aom_internal_error_info *error) {
  const int num_planes = seq_params->monochrome ? 1 : MAX_MB_PLANE;
  const int max_sb_square_y = 1 << num_pels_log2_lookup[seq_params->sb_size];
  const int max_sb_square_uv = max_sb_square_y >> (seq_params->subsampling_x +
                                                   seq_params->subsampling_y);
  for (int i = 0; i < num_planes; i++) {
    const int max_num_pix =
        (i == AOM_PLANE_Y) ? max_sb_square_y : max_sb_square_uv;
    AOM_CHECK_MEM_ERROR(error, shared_bufs->coeff_buf[i],
                        aom_memalign(32, max_num_pix * sizeof(tran_low_t)));
    AOM_CHECK_MEM_ERROR(error, shared_bufs->qcoeff_buf[i],
                        aom_memalign(32, max_num_pix * sizeof(tran_low_t)));
    AOM_CHECK_MEM_ERROR(error, shared_bufs->dqcoeff_buf[i],
                        aom_memalign(32, max_num_pix * sizeof(tran_low_t)));
  }
}